

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mersenne.h
# Opt level: O0

void __thiscall FastPForLib::ZRandom::seed(ZRandom *this,uint iSeed)

{
  int i_1;
  int i;
  uint iSeed_local;
  ZRandom *this_local;
  
  this->nValues = 0;
  this->MT[0] = iSeed;
  for (i = 1; i < 0x270; i = i + 1) {
    this->MT[i] = this->MT[i + -1] * 0x10dcd + 1;
  }
  for (i_1 = 0; i_1 < 0x270; i_1 = i_1 + 1) {
    this->map[i_1] = this->MT + (i_1 + 0x18d) % 0x270;
  }
  return;
}

Assistant:

void ZRandom::seed(unsigned iSeed) {
  nValues = 0;
  // Seed the array used in random number generation.
  MT[0] = iSeed;
  for (int i = 1; i < N; ++i) {
    MT[i] = 1 + (69069 * MT[i - 1]);
  }
  // Compute map once to avoid % in inner loop.
  for (int i = 0; i < N; ++i) {
    map[i] = MT + ((i + M) % N);
  }
}